

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

void udp_send_creq(udp_ep *ep,udp_pipe *p)

{
  int iVar1;
  nni_time nVar2;
  nng_time nVar3;
  udp_sp_msg local_34;
  
  local_34._0_2_ = 0x101;
  local_34.data.us_type = p->proto;
  local_34._4_4_ = p->self_id;
  local_34._8_4_ = p->peer_id;
  local_34.data.us_sequence = p->self_seq;
  p->self_seq = local_34.data.us_sequence + 1;
  local_34.data.us_length = p->rcvmax;
  iVar1 = p->refresh + 999;
  local_34.creq.us_refresh =
       (char)(uint)((ulong)((long)iVar1 * 0x10624dd3) >> 0x26) - (char)(iVar1 >> 0x1f);
  nVar2 = nni_clock();
  nVar3 = (long)p->refresh + nVar2;
  p->next_creq = nVar3;
  p->next_wake = nVar3;
  udp_pipe_schedule(p);
  udp_queue_tx(ep,&p->peer_addr,&local_34,(nni_msg *)0x0);
  return;
}

Assistant:

static void
udp_send_creq(udp_ep *ep, udp_pipe *p)
{
	udp_sp_creq creq;
	creq.us_ver       = 0x1;
	creq.us_op_code   = OPCODE_CREQ;
	creq.us_type      = p->proto;
	creq.us_sender_id = p->self_id;
	creq.us_peer_id   = p->peer_id;
	creq.us_sequence  = p->self_seq++;
	creq.us_recv_max  = p->rcvmax;
	creq.us_refresh   = (p->refresh + NNI_SECOND - 1) / NNI_SECOND;
	p->next_creq      = nni_clock() + UDP_PIPE_REFRESH(p);
	p->next_wake      = p->next_creq;

	udp_pipe_schedule(p);
	udp_queue_tx(ep, &p->peer_addr, (void *) &creq, NULL);
}